

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

_Bool oonf_layer2_data_compare
                (oonf_layer2_value *left,oonf_layer2_value *right,
                oonf_layer2_data_comparator_type comparator,oonf_layer2_data_type data_type)

{
  int iVar1;
  bool bVar2;
  
  if (data_type == OONF_LAYER2_NETWORK_DATA) {
    iVar1 = memcmp(left,right,0x12);
LAB_001124df:
    switch(comparator) {
    case OONF_LAYER2_DATA_CMP_EQUALS:
      bVar2 = iVar1 == 0;
      break;
    case OONF_LAYER2_DATA_CMP_NOT_EQUALS:
      bVar2 = iVar1 != 0;
      break;
    case OONF_LAYER2_DATA_CMP_LESSER:
      bVar2 = SUB41((uint)iVar1 >> 0x1f,0);
      break;
    case OONF_LAYER2_DATA_CMP_LESSER_OR_EQUALS:
      bVar2 = iVar1 < 1;
      break;
    case OONF_LAYER2_DATA_CMP_GREATER:
      bVar2 = 0 < iVar1;
      break;
    case OONF_LAYER2_DATA_CMP_GREATER_OR_EQUALS:
      bVar2 = -1 < iVar1;
      break;
    default:
      goto switchD_001124f4_default;
    }
  }
  else {
    if (data_type == OONF_LAYER2_BOOLEAN_DATA) {
      iVar1 = (uint)(left->addr)._addr[0] - (uint)(right->addr)._addr[0];
      goto LAB_001124df;
    }
    if (data_type == OONF_LAYER2_INTEGER_DATA) {
      iVar1 = 1;
      if (left->integer <= right->integer) {
        iVar1 = -(uint)(left->integer < right->integer);
      }
      goto LAB_001124df;
    }
switchD_001124f4_default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
oonf_layer2_data_compare(const union oonf_layer2_value *left, const union oonf_layer2_value *right,
  enum oonf_layer2_data_comparator_type comparator, enum oonf_layer2_data_type data_type) {
  int result;

  switch (data_type) {
    case OONF_LAYER2_INTEGER_DATA:
      if (left->integer > right->integer) {
        result = 1;
      }
      else if (left->integer < right->integer) {
        result = -1;
      }
      else {
        result = 0;
      }
      break;
    case OONF_LAYER2_BOOLEAN_DATA:
      result = memcmp(&left->boolean, &right->boolean, sizeof(left->boolean));
      break;
    case OONF_LAYER2_NETWORK_DATA:
      result = memcmp(&left->addr, &right->addr, sizeof(left->addr));
      break;
    default:
      return false;
  }

  switch (comparator) {
    case OONF_LAYER2_DATA_CMP_EQUALS:
      return result == 0;
    case OONF_LAYER2_DATA_CMP_NOT_EQUALS:
      return result != 0;
    case OONF_LAYER2_DATA_CMP_LESSER:
      return result < 0;
    case OONF_LAYER2_DATA_CMP_LESSER_OR_EQUALS:
      return result <= 0;
    case OONF_LAYER2_DATA_CMP_GREATER:
      return result > 0;
    case OONF_LAYER2_DATA_CMP_GREATER_OR_EQUALS:
      return result >= 0;
    default:
      return false;
  }
}